

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

void __thiscall Stat_psprites::Stat_psprites(Stat_psprites *this)

{
  Stat_psprites *this_local;
  
  FStat::FStat(&this->super_FStat,"psprites");
  (this->super_FStat)._vptr_FStat = (_func_int **)&PTR__Stat_psprites_00b6d888;
  return;
}

Assistant:

ADD_STAT(psprites)
{
	FString out;
	DPSprite *pspr;
	for (int i = 0; i < MAXPLAYERS; i++)
	{
		if (!playeringame[i])
			continue;

		out.AppendFormat("[psprites] player: %d | layers: ", i);

		pspr = players[i].psprites;
		while (pspr)
		{
			out.AppendFormat("%d, ", pspr->GetID());

			pspr = pspr->GetNext();
		}

		out.AppendFormat("\n");
	}

	return out;
}